

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O0

int cvLsJacTimesVecBWrapper
              (N_Vector vB,N_Vector JvB,sunrealtype t,N_Vector yB,N_Vector fyB,void *cvode_mem,
              N_Vector tmpB)

{
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  int retval;
  CVLsMemB cvlsB_mem;
  CVodeBMem cvB_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  CVodeBMem *in_stack_ffffffffffffff88;
  CVadjMem *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  void *in_stack_ffffffffffffffa8;
  long local_50;
  CVodeMem local_48;
  int local_4;
  
  local_4 = cvLs_AccessLMemBCur(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                                (CVodeMem *)
                                CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                                in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                                (CVLsMemB *)0x13efbd);
  if (local_4 == 0) {
    iVar1 = (**(code **)(local_50 + 0xa8))(in_XMM0_Qa,local_48,*(undefined8 *)(local_50 + 0x1f8),0);
    if (iVar1 == 0) {
      local_4 = (**(code **)(in_stack_ffffffffffffffa0 + 0x20))
                          (in_XMM0_Qa,in_RDI,in_RSI,*(undefined8 *)(local_50 + 0x1f8),in_RDX,in_RCX,
                           *(undefined8 *)((long)in_stack_ffffffffffffffa8 + 0x40),in_R9);
    }
    else {
      cvProcessError(local_48,-1,0xa88,"cvLsJacTimesVecBWrapper",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                     ,"Bad t for interpolation.");
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

static int cvLsJacTimesVecBWrapper(N_Vector vB, N_Vector JvB, sunrealtype t,
                                   N_Vector yB, N_Vector fyB, void* cvode_mem,
                                   N_Vector tmpB)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  CVLsMemB cvlsB_mem;
  int retval;

  /* access relevant memory structures */
  retval = cvLs_AccessLMemBCur(cvode_mem, "cvLsJacTimesVecBWrapper", &cv_mem,
                               &ca_mem, &cvB_mem, &cvlsB_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* Forward solution from interpolation */
  retval = ca_mem->ca_IMget(cv_mem, t, ca_mem->ca_ytmp, NULL);
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSG_LS_BAD_TINTERP);
    return (-1);
  }

  /* Call user's adjoint jtimesB routine */
  return (cvlsB_mem->jtimesB(vB, JvB, t, ca_mem->ca_ytmp, yB, fyB,
                             cvB_mem->cv_user_data, tmpB));
}